

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O3

void skip(vorb *z,int n)

{
  uint8 *puVar1;
  long lVar2;
  
  if (z->stream != (uint8 *)0x0) {
    puVar1 = z->stream + n;
    z->stream = puVar1;
    if (z->stream_end <= puVar1) {
      z->eof = 1;
    }
    return;
  }
  lVar2 = ftell((FILE *)z->f);
  fseek((FILE *)z->f,n + lVar2,0);
  return;
}

Assistant:

static void skip(vorb *z, int n)
{
   if (USE_MEMORY(z)) {
      z->stream += n;
      if (z->stream >= z->stream_end) z->eof = 1;
      return;
   }
   #ifndef STB_VORBIS_NO_STDIO
   {
      long x = ftell(z->f);
      fseek(z->f, x+n, SEEK_SET);
   }
   #endif
}